

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O0

void __thiscall
NewFunctionProcessingVisitor::TraverseToChildByIndex(NewFunctionProcessingVisitor *this)

{
  int iVar1;
  size_type sVar2;
  runtime_error *this_00;
  reference ppNVar3;
  NewFunctionProcessingVisitor *this_local;
  
  iVar1 = this->current_layer_->traverse_index;
  sVar2 = std::vector<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>::size
                    (&this->current_layer_->children_);
  if (sVar2 <= (ulong)(long)iVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Error while traversing...");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->current_layer_->traverse_index = this->current_layer_->traverse_index + 1;
  ppNVar3 = std::vector<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>::operator[]
                      (&this->current_layer_->children_,
                       (long)(this->current_layer_->traverse_index + -1));
  this->current_layer_ = *ppNVar3;
  return;
}

Assistant:

void NewFunctionProcessingVisitor::TraverseToChildByIndex() {
  if (current_layer_->traverse_index >= current_layer_->children_.size()) {
    throw std::runtime_error("Error while traversing...");
  }

  ++current_layer_->traverse_index;
  current_layer_ =
      current_layer_->children_[current_layer_->traverse_index - 1];
}